

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::copy_file(Twine *From,Twine *To)

{
  int __fd;
  uint uVar1;
  undefined8 in_RAX;
  error_code eVar3;
  int WriteFD;
  int ReadFD;
  undefined8 local_28;
  error_category *peVar2;
  
  local_28 = in_RAX;
  eVar3 = openFileForRead(From,(int *)((long)&local_28 + 4),F_None,(SmallVectorImpl<char> *)0x0);
  peVar2 = eVar3._M_cat;
  uVar1 = eVar3._M_value;
  if (uVar1 == 0) {
    eVar3 = openFileForWrite(To,(int *)&local_28,CD_CreateAlways,F_None,0x1b6);
    peVar2 = eVar3._M_cat;
    __fd = local_28._4_4_;
    uVar1 = eVar3._M_value;
    if (uVar1 == 0) {
      eVar3 = copy_file_internal(local_28._4_4_,(int)local_28);
      peVar2 = eVar3._M_cat;
      uVar1 = eVar3._M_value;
      close(__fd);
      local_28._4_4_ = (int)local_28;
    }
    close(local_28._4_4_);
  }
  eVar3._4_4_ = 0;
  eVar3._M_value = uVar1;
  eVar3._M_cat = peVar2;
  return eVar3;
}

Assistant:

std::error_code copy_file(const Twine &From, const Twine &To) {
  int ReadFD, WriteFD;
  if (std::error_code EC = openFileForRead(From, ReadFD, OF_None))
    return EC;
  if (std::error_code EC =
          openFileForWrite(To, WriteFD, CD_CreateAlways, OF_None)) {
    close(ReadFD);
    return EC;
  }

  std::error_code EC = copy_file_internal(ReadFD, WriteFD);

  close(ReadFD);
  close(WriteFD);

  return EC;
}